

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O3

void graph_copy_init_tensor
               (ggml_hash_set *hash_set,ggml_tensor **node_copies,_Bool *node_init,ggml_tensor *src)

{
  ggml_tensor *dst;
  ggml_status gVar1;
  size_t sVar2;
  int i;
  long lVar3;
  
  sVar2 = ggml_hash_find(hash_set,src);
  if (node_init[sVar2] == false) {
    node_init[sVar2] = true;
    dst = node_copies[sVar2];
    if (dst->view_src == (ggml_tensor *)0x0) {
      ggml_backend_tensor_copy(src,dst);
    }
    else {
      graph_copy_init_tensor(hash_set,node_copies,node_init,src->view_src);
      gVar1 = ggml_backend_view_init(dst);
      if (gVar1 != GGML_STATUS_SUCCESS) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
                   ,0x6b2,"GGML_ASSERT(%s) failed","status == GGML_STATUS_SUCCESS");
      }
    }
    lVar3 = 0;
    do {
      if (src->src[lVar3] != (ggml_tensor *)0x0) {
        graph_copy_init_tensor(hash_set,node_copies,node_init,src->src[lVar3]);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 10);
  }
  return;
}

Assistant:

static void graph_copy_init_tensor(struct ggml_hash_set * hash_set, struct ggml_tensor ** node_copies, bool * node_init, struct ggml_tensor * src) {
    size_t id = ggml_hash_find(hash_set, src);
    if (node_init[id]) {
        return;
    }
    node_init[id] = true;

    struct ggml_tensor * dst = node_copies[id];
    if (dst->view_src != NULL) {
        graph_copy_init_tensor(hash_set, node_copies, node_init, src->view_src);
        enum ggml_status status = ggml_backend_view_init(dst);
        GGML_ASSERT(status == GGML_STATUS_SUCCESS);
    }
    else {
        ggml_backend_tensor_copy(src, dst);
    }

    // init src
    for (int i = 0; i < GGML_MAX_SRC; i++) {
        struct ggml_tensor * s = src->src[i];
        if (s == NULL) {
            continue;
        }
        graph_copy_init_tensor(hash_set, node_copies, node_init, s);
    }
}